

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O3

bool S2LatLngRect::IntersectsLngEdge(S2Point *a,S2Point *b,R1Interval *lat,double lng)

{
  int iVar1;
  S2LatLng local_70;
  S2LatLng local_60;
  S2Point local_50;
  S2Point local_38;
  
  local_60.coords_.c_[0] = (lat->bounds_).c_[0];
  local_60.coords_.c_[1] = lng;
  S2LatLng::ToPoint(&local_38,&local_60);
  local_70.coords_.c_[0] = (lat->bounds_).c_[1];
  local_70.coords_.c_[1] = lng;
  S2LatLng::ToPoint(&local_50,&local_70);
  iVar1 = S2::CrossingSign(a,b,&local_38,&local_50);
  return 0 < iVar1;
}

Assistant:

bool S2LatLngRect::IntersectsLngEdge(const S2Point& a, const S2Point& b,
                                     const R1Interval& lat, double lng) {
  // Return true if the segment AB intersects the given edge of constant
  // longitude.  The nice thing about edges of constant longitude is that
  // they are straight lines on the sphere (geodesics).

  return S2::CrossingSign(
      a, b, S2LatLng::FromRadians(lat.lo(), lng).ToPoint(),
      S2LatLng::FromRadians(lat.hi(), lng).ToPoint()) > 0;
}